

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  __pid_t _Var1;
  uint uVar2;
  ostream *poVar3;
  int __sig;
  string *psVar4;
  void *__stat_loc;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__x;
  undefined1 local_550 [8];
  MyProcess process;
  MyProcess pipe_output;
  MyProcess kill_example;
  MyProcess pipe_input;
  MyProcess env_example;
  string local_288;
  string local_268 [32];
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  undefined1 local_48 [8];
  MyProcessEnvironment env;
  
  std::__cxx11::string::string
            ((string *)&env_example.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count,
             "redirection_example",
             (allocator *)&kill_example.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count);
  MyProcess::MyProcess
            ((MyProcess *)local_550,
             (string *)&env_example.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string
            ((string *)&env_example.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::string
            ((string *)&local_288,"../Test/In/redirection_in.txt",
             (allocator *)&kill_example.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count);
  MyProcess::set_input_file((MyProcess *)local_550,&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::string
            (local_268,"arg1 arg2 arg3",
             (allocator *)&kill_example.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::_M_assign((string *)(process.program_name.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_268);
  std::__cxx11::string::string
            ((string *)&local_248,"../Test/Out/redirection_out.txt",
             (allocator *)&kill_example.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count);
  psVar4 = &local_248;
  MyProcess::set_output_file((MyProcess *)local_550,psVar4);
  std::__cxx11::string::~string((string *)&local_248);
  MyProcess::start((MyProcess *)local_550);
  _Var1 = MyProcess::wait((MyProcess *)local_550,psVar4);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,_Var1);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::string
            ((string *)&local_228,"pipe_input",
             (allocator *)&process.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count);
  MyProcess::MyProcess
            ((MyProcess *)&kill_example.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count,
             &local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::string
            ((string *)&local_208,"pipe_output",
             (allocator *)&pipe_output.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count);
  MyProcess::MyProcess
            ((MyProcess *)&process.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count,
             &local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::string
            ((string *)&local_1e8,"../Test/In/pipe_in.txt",
             (allocator *)&pipe_output.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count);
  MyProcess::set_input_file
            ((MyProcess *)&kill_example.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count,
             &local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  MyProcess::set_output_process
            ((MyProcess *)&kill_example.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (MyProcess *)&process.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::string
            ((string *)&local_1c8,"../Test/Out/pipe_out.txt",
             (allocator *)&pipe_output.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count);
  psVar4 = &local_1c8;
  MyProcess::set_output_file
            ((MyProcess *)&process.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count,psVar4);
  std::__cxx11::string::~string((string *)&local_1c8);
  MyProcess::start((MyProcess *)
                   &kill_example.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count);
  MyProcess::start((MyProcess *)&process.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count);
  uVar2 = MyProcess::wait((MyProcess *)
                          &kill_example.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          psVar4);
  __stat_loc = (void *)(ulong)uVar2;
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  _Var1 = MyProcess::wait((MyProcess *)
                          &process.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          __stat_loc);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,_Var1);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::string
            ((string *)&local_1a8,"kill_example",
             (allocator *)&pipe_input.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count);
  MyProcess::MyProcess
            ((MyProcess *)&pipe_output.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count,
             &local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::string
            ((string *)&local_188,"../Test/In/kill_in.txt",
             (allocator *)&pipe_input.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count);
  MyProcess::set_input_file
            ((MyProcess *)&pipe_output.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count,
             &local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::string
            ((string *)&local_168,"../Test/Out/kill_out.txt",
             (allocator *)&pipe_input.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count);
  psVar4 = &local_168;
  MyProcess::set_output_file
            ((MyProcess *)&pipe_output.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count,
             psVar4);
  _Var1 = (__pid_t)psVar4;
  std::__cxx11::string::~string((string *)&local_168);
  MyProcess::start((MyProcess *)
                   &pipe_output.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count);
  sleep(5);
  MyProcess::kill((MyProcess *)&pipe_output.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count
                  ,_Var1,__sig);
  env.env._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&env;
  env.env._M_t._M_impl._0_4_ = 0;
  env.env._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  env.env._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  env.env._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  env.env._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       env.env._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::string
            ((string *)&local_148,"key1",
             (allocator *)&pipe_input.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::string
            ((string *)&local_128,"value1",
             (allocator *)((long)&env.env._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  MyProcessEnvironment::set((MyProcessEnvironment *)local_48,&local_148,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string
            ((string *)&local_108,"key2",
             (allocator *)&pipe_input.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::string
            ((string *)&local_e8,"value2",
             (allocator *)((long)&env.env._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  MyProcessEnvironment::set((MyProcessEnvironment *)local_48,&local_108,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::string
            ((string *)&local_c8,"key3",
             (allocator *)&pipe_input.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::string
            ((string *)&local_a8,"value3",
             (allocator *)((long)&env.env._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  MyProcessEnvironment::set((MyProcessEnvironment *)local_48,&local_c8,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string
            ((string *)&local_88,"environment_vars_example",
             (allocator *)((long)&env.env._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  MyProcess::MyProcess
            ((MyProcess *)&pipe_input.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count,
             &local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string
            ((string *)&local_68,"../Test/Out/env_example_out.txt",
             (allocator *)((long)&env.env._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  MyProcess::set_output_file
            ((MyProcess *)&pipe_input.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count,
             &local_68);
  std::__cxx11::string::~string((string *)&local_68);
  __x = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_48;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&env_example.out,__x);
  MyProcess::start((MyProcess *)&pipe_input.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count
                  );
  _Var1 = MyProcess::wait((MyProcess *)
                          &pipe_input.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count,__x);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,_Var1);
  std::endl<char,std::char_traits<char>>(poVar3);
  MyProcess::~MyProcess
            ((MyProcess *)&pipe_input.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_48);
  MyProcess::~MyProcess
            ((MyProcess *)&pipe_output.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count);
  MyProcess::~MyProcess
            ((MyProcess *)&process.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count);
  MyProcess::~MyProcess
            ((MyProcess *)&kill_example.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count);
  MyProcess::~MyProcess((MyProcess *)local_550);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    MyProcess process("redirection_example");
    process.set_input_file("../Test/In/redirection_in.txt");
    process.set_arguments("arg1 arg2 arg3");
    process.set_output_file("../Test/Out/redirection_out.txt");
    process.start();
    std::cout << process.wait() << std::endl;


    MyProcess pipe_input("pipe_input");
    MyProcess pipe_output("pipe_output");
    pipe_input.set_input_file("../Test/In/pipe_in.txt");
    pipe_input.set_output_process(pipe_output);
    pipe_output.set_output_file("../Test/Out/pipe_out.txt");

    pipe_input.start();
    pipe_output.start();
    std::cout << pipe_input.wait() << std::endl;
    std::cout << pipe_output.wait() << std::endl;

    MyProcess kill_example("kill_example");
    kill_example.set_input_file("../Test/In/kill_in.txt");
    kill_example.set_output_file("../Test/Out/kill_out.txt");
    kill_example.start();

#if defined(__linux__) || defined(__APPLE__)
    sleep(5);
#elif _WIN32
    Sleep(5000);
#endif

    kill_example.kill();

    MyProcessEnvironment env;
    env.set("key1", "value1");
    env.set("key2", "value2");
    env.set("key3", "value3");

    MyProcess env_example("environment_vars_example");
    env_example.set_output_file("../Test/Out/env_example_out.txt");
    env_example.set_environment(env);

    env_example.start();
    std::cout << env_example.wait() << std::endl;

    return 0;
}